

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_cfg_test.c
# Opt level: O0

int main(void)

{
  RK_S64 RVar1;
  long lVar2;
  long lVar3;
  char *pcVar4;
  MppEncCfgImpl *impl;
  RK_S32 aq_thrd_i_ret [16];
  RK_S32 aq_thrd_i [16];
  RK_S32 bps_target;
  RK_S32 rc_mode;
  RK_S64 start;
  RK_S64 end;
  MppEncCfg cfg;
  MPP_RET ret;
  
  cfg._4_4_ = 0;
  cfg._0_4_ = 0;
  mpp_enc_cfg_show();
  _mpp_log_l(4,"mpp_enc_cfg_test","mpp_enc_cfg_test start\n",0);
  cfg._0_4_ = mpp_enc_cfg_init(&end);
  if ((int)cfg == 0) {
    aq_thrd_i[0xf] = 1;
    aq_thrd_i[0xe] = 400000;
    memcpy(aq_thrd_i_ret + 0xe,&DAT_00102220,0x40);
    memset(&impl,0xff,0x40);
    RVar1 = end;
    _mpp_log_l(4,"mpp_enc_cfg_test","before set: rc mode %d bps_target %d\n",0,
               *(undefined4 *)(end + 0x9c),*(undefined4 *)(end + 0xa4));
    lVar2 = mpp_time();
    cfg._0_4_ = mpp_enc_cfg_set_u32(end,"rc:mode",aq_thrd_i[0xf]);
    cfg._0_4_ = mpp_enc_cfg_set_s32(end,"rc:mode",aq_thrd_i[0xf]);
    cfg._0_4_ = mpp_enc_cfg_set_s32(end,"rc:bps",400000);
    cfg._0_4_ = mpp_enc_cfg_set_s32(end,"rc:bps_target",aq_thrd_i[0xe]);
    lVar3 = mpp_time();
    _mpp_log_l(4,"mpp_enc_cfg_test","set s32 time %lld us\n",0,lVar3 - lVar2);
    _mpp_log_l(4,"mpp_enc_cfg_test","after  set: rc mode %d bps_target %d\n",0,
               *(undefined4 *)(RVar1 + 0x9c),*(undefined4 *)(RVar1 + 0xa4));
    aq_thrd_i[0xf] = 0;
    aq_thrd_i[0xe] = 0;
    _mpp_log_l(4,"mpp_enc_cfg_test","before get: rc mode %d bps_target %d\n",0,0,0);
    cfg._0_4_ = mpp_enc_cfg_get_s32(end,"rc:mode",aq_thrd_i + 0xf);
    cfg._0_4_ = mpp_enc_cfg_get_s32(end,"rc:bps_target",aq_thrd_i + 0xe);
    _mpp_log_l(4,"mpp_enc_cfg_test","after  get: rc mode %d bps_target %d\n",0,aq_thrd_i[0xf],
               aq_thrd_i[0xe]);
    _mpp_log_l(4,"mpp_enc_cfg_test",
               "before set: rc aq_thrd_i: %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d\n"
               ,0,impl._0_4_,impl._4_4_,aq_thrd_i_ret[0],aq_thrd_i_ret[1],aq_thrd_i_ret[2],
               aq_thrd_i_ret[3],aq_thrd_i_ret[4],aq_thrd_i_ret[5],aq_thrd_i_ret[6],aq_thrd_i_ret[7],
               aq_thrd_i_ret[8],aq_thrd_i_ret[9],aq_thrd_i_ret[10],aq_thrd_i_ret[0xb],
               aq_thrd_i_ret[0xc],aq_thrd_i_ret[0xd]);
    cfg._0_4_ = mpp_enc_cfg_set_st(end,"hw:aq_step_i",aq_thrd_i_ret + 0xe);
    cfg._0_4_ = mpp_enc_cfg_get_st(end,"hw:aq_step_i",&impl);
    _mpp_log_l(4,"mpp_enc_cfg_test",
               "after  get: rc aq_thrd_i: %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d\n"
               ,0,impl._0_4_,impl._4_4_,aq_thrd_i_ret[0],aq_thrd_i_ret[1],aq_thrd_i_ret[2],
               aq_thrd_i_ret[3],aq_thrd_i_ret[4],aq_thrd_i_ret[5],aq_thrd_i_ret[6],aq_thrd_i_ret[7],
               aq_thrd_i_ret[8],aq_thrd_i_ret[9],aq_thrd_i_ret[10],aq_thrd_i_ret[0xb],
               aq_thrd_i_ret[0xc],aq_thrd_i_ret[0xd]);
    cfg._0_4_ = mpp_enc_cfg_deinit(end);
    if ((int)cfg != 0) {
      _mpp_log_l(2,"mpp_enc_cfg_test","mpp_enc_cfg_deinit failed\n",0);
    }
  }
  else {
    _mpp_log_l(2,"mpp_enc_cfg_test","mpp_enc_cfg_init failed\n",0);
  }
  pcVar4 = "success";
  if ((int)cfg != 0) {
    pcVar4 = "failed";
  }
  _mpp_log_l(4,"mpp_enc_cfg_test","mpp_enc_cfg_test done %s\n",0,pcVar4);
  return (int)cfg;
}

Assistant:

int main()
{
    MPP_RET ret = MPP_OK;
    MppEncCfg cfg;
    RK_S64 end = 0;
    RK_S64 start = 0;

    mpp_enc_cfg_show();

    mpp_log("mpp_enc_cfg_test start\n");

    ret = mpp_enc_cfg_init(&cfg);
    if (ret) {
        mpp_err("mpp_enc_cfg_init failed\n");
        goto DONE;
    }

    RK_S32 rc_mode = 1;
    RK_S32 bps_target = 400000;
    RK_S32 aq_thrd_i[16] = {
        0,  0,  0,  0,
        3,  3,  5,  5,
        8,  8,  8,  15,
        15, 20, 25, 35
    };

    RK_S32 aq_thrd_i_ret[16] = {
        -1, -1, -1, -1,
        -1, -1, -1, -1,
        -1, -1, -1, -1,
        -1, -1, -1, -1,
    };

    MppEncCfgImpl *impl = (MppEncCfgImpl *)cfg;

    mpp_log("before set: rc mode %d bps_target %d\n",
            impl->cfg.rc.rc_mode, impl->cfg.rc.bps_target);

    start = mpp_time();
    ret = mpp_enc_cfg_set_u32(cfg, "rc:mode", rc_mode);
    ret = mpp_enc_cfg_set_s32(cfg, "rc:mode", rc_mode);
    ret = mpp_enc_cfg_set_s32(cfg, "rc:bps", 400000);
    ret = mpp_enc_cfg_set_s32(cfg, "rc:bps_target", bps_target);
    end = mpp_time();
    mpp_log("set s32 time %lld us\n", end - start);

    mpp_log("after  set: rc mode %d bps_target %d\n",
            impl->cfg.rc.rc_mode, impl->cfg.rc.bps_target);

    rc_mode = 0;
    bps_target = 0;

    mpp_log("before get: rc mode %d bps_target %d\n", rc_mode, bps_target);

    ret = mpp_enc_cfg_get_s32(cfg, "rc:mode", &rc_mode);
    ret = mpp_enc_cfg_get_s32(cfg, "rc:bps_target", &bps_target);
    mpp_log("after  get: rc mode %d bps_target %d\n", rc_mode, bps_target);

    mpp_log("before set: rc aq_thrd_i: %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d\n",
            aq_thrd_i_ret[0], aq_thrd_i_ret[1], aq_thrd_i_ret[2], aq_thrd_i_ret[3],
            aq_thrd_i_ret[4], aq_thrd_i_ret[5], aq_thrd_i_ret[6], aq_thrd_i_ret[7],
            aq_thrd_i_ret[8], aq_thrd_i_ret[9], aq_thrd_i_ret[10], aq_thrd_i_ret[11],
            aq_thrd_i_ret[12], aq_thrd_i_ret[13], aq_thrd_i_ret[14], aq_thrd_i_ret[15]);

    ret = mpp_enc_cfg_set_st(cfg, "hw:aq_step_i", aq_thrd_i);
    ret = mpp_enc_cfg_get_st(cfg, "hw:aq_step_i", aq_thrd_i_ret);

    mpp_log("after  get: rc aq_thrd_i: %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d %2d\n",
            aq_thrd_i_ret[0], aq_thrd_i_ret[1], aq_thrd_i_ret[2], aq_thrd_i_ret[3],
            aq_thrd_i_ret[4], aq_thrd_i_ret[5], aq_thrd_i_ret[6], aq_thrd_i_ret[7],
            aq_thrd_i_ret[8], aq_thrd_i_ret[9], aq_thrd_i_ret[10], aq_thrd_i_ret[11],
            aq_thrd_i_ret[12], aq_thrd_i_ret[13], aq_thrd_i_ret[14], aq_thrd_i_ret[15]);

    ret = mpp_enc_cfg_deinit(cfg);
    if (ret) {
        mpp_err("mpp_enc_cfg_deinit failed\n");
        goto DONE;
    }

DONE:
    mpp_log("mpp_enc_cfg_test done %s\n", ret ? "failed" : "success");
    return ret;
}